

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::ClearCase::genTessellationControlSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this,bool setBBox)

{
  string *psVar1;
  ostringstream buf;
  undefined1 local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n",0x34);
  if ((char)this != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"${PRIMITIVE_BOUNDING_BOX_REQUIRE}\n",0x22);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "layout(vertices=3) out;\nin highp vec4 v_vertex_color[];\nout highp vec4 v_tess_eval_color[];\nvoid main()\n{\n\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n\tv_tess_eval_color[gl_InvocationID] = v_vertex_color[gl_InvocationID];\n\tgl_TessLevelOuter[0] = 2.8;\n\tgl_TessLevelOuter[1] = 2.8;\n\tgl_TessLevelOuter[2] = 2.8;\n\tgl_TessLevelInner[0] = 2.8;\n"
             ,0x170);
  if ((char)this != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "\n\t${PRIM_GL_BOUNDING_BOX}[0] = min(min(gl_in[0].gl_Position,\n\t                               gl_in[1].gl_Position),\n\t                           gl_in[2].gl_Position);\n\t${PRIM_GL_BOUNDING_BOX}[1] = max(max(gl_in[0].gl_Position,\n\t                               gl_in[1].gl_Position),\n\t                           gl_in[2].gl_Position);\n"
               ,0x14d);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  psVar1 = (string *)std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return psVar1;
}

Assistant:

std::string ClearCase::genTessellationControlSource (bool setBBox) const
{
	std::ostringstream buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"${TESSELLATION_SHADER_REQUIRE}\n";

	if (setBBox)
		buf << "${PRIMITIVE_BOUNDING_BOX_REQUIRE}\n";

	buf <<	"layout(vertices=3) out;\n"
			"in highp vec4 v_vertex_color[];\n"
			"out highp vec4 v_tess_eval_color[];\n"
			"void main()\n"
			"{\n"
			"	gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
			"	v_tess_eval_color[gl_InvocationID] = v_vertex_color[gl_InvocationID];\n"
			"	gl_TessLevelOuter[0] = 2.8;\n"
			"	gl_TessLevelOuter[1] = 2.8;\n"
			"	gl_TessLevelOuter[2] = 2.8;\n"
			"	gl_TessLevelInner[0] = 2.8;\n";

	if (setBBox)
	{
		buf <<	"\n"
		"	${PRIM_GL_BOUNDING_BOX}[0] = min(min(gl_in[0].gl_Position,\n"
		"	                               gl_in[1].gl_Position),\n"
		"	                           gl_in[2].gl_Position);\n"
		"	${PRIM_GL_BOUNDING_BOX}[1] = max(max(gl_in[0].gl_Position,\n"
		"	                               gl_in[1].gl_Position),\n"
		"	                           gl_in[2].gl_Position);\n";
	}

	buf << "}\n";
	return buf.str();
}